

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

int __thiscall FilteredLT::get_visited_innodes(FilteredLT *this)

{
  return this->visited_innodes;
}

Assistant:

int FilteredLT::get_visited_innodes() const {
	// visited_innodes = 0;
	// for (int i = 0; i < p->nbNodes(); i++) {
	//     if (p->getNodeVar(i).isFixed() && p->getNodeVar(i).isTrue())
	//         if (visited_dfs(i))
	//             visited_innodes++;
	// }
	return visited_innodes;
}